

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

char * FindModuleCodeWithSourceLocation(ExpressionContext *ctx,char *position)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ModuleData **ppMVar4;
  char *pcVar5;
  uint local_24;
  uint i;
  char *position_local;
  ExpressionContext *ctx_local;
  
  if ((ctx->code <= position) &&
     (pcVar5 = ctx->code, sVar3 = strlen(ctx->code), position <= pcVar5 + sVar3)) {
    return ctx->code;
  }
  local_24 = 0;
  while( true ) {
    uVar2 = SmallArray<ModuleData_*,_128U>::size(&ctx->imports);
    if (uVar2 <= local_24) {
      return (char *)0x0;
    }
    ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,local_24);
    bVar1 = HasSourceCode((*ppMVar4)->bytecode,position);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,local_24);
  pcVar5 = FindSource((*ppMVar4)->bytecode);
  return pcVar5;
}

Assistant:

const char* FindModuleCodeWithSourceLocation(ExpressionContext &ctx, const char *position)
{
	if(position >= ctx.code && position <= ctx.code + strlen(ctx.code))
		return ctx.code;

	for(unsigned i = 0; i < ctx.imports.size(); i++)
	{
		if(HasSourceCode(ctx.imports[i]->bytecode, position))
			return FindSource(ctx.imports[i]->bytecode);
	}

	return NULL;
}